

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O3

REF_STATUS ref_swap_outward_norm(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE ref_node;
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  REF_BOOL valid;
  REF_INT node3;
  REF_INT node2;
  REF_INT nodes [27];
  int local_b4;
  REF_INT local_b0;
  REF_INT local_ac;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  
  ref_node = ref_grid->node;
  *allowed = 0;
  uVar1 = ref_swap_node23(ref_grid,node0,node1,&local_ac,&local_b0);
  if (uVar1 == 0) {
    local_a4 = local_b0;
    local_a0 = local_ac;
    local_a8 = node0;
    uVar1 = ref_node_tri_twod_orientation(ref_node,&local_a8,&local_b4);
    if (uVar1 == 0) {
      if (local_b4 == 0) {
        return 0;
      }
      local_a4 = local_ac;
      local_a0 = local_b0;
      local_a8 = node1;
      uVar1 = ref_node_tri_twod_orientation(ref_node,&local_a8,&local_b4);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x1c2,"ref_swap_outward_norm",(ulong)uVar1,"valid");
        return uVar1;
      }
      if (local_b4 == 0) {
        return 0;
      }
      *allowed = 1;
      return 0;
    }
    pcVar3 = "valid";
    uVar2 = 0x1bc;
  }
  else {
    pcVar3 = "other nodes";
    uVar2 = 0x1b7;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",uVar2,
         "ref_swap_outward_norm",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_swap_outward_norm(REF_GRID ref_grid,
                                                REF_INT node0, REF_INT node1,
                                                REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node2, node3;
  REF_BOOL valid;

  *allowed = REF_FALSE;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");

  nodes[0] = node0;
  nodes[1] = node3;
  nodes[2] = node2;
  RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
  if (!valid) return REF_SUCCESS;

  nodes[0] = node1;
  nodes[1] = node2;
  nodes[2] = node3;
  RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
  if (!valid) return REF_SUCCESS;

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}